

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::GridDataType2::Encode(GridDataType2 *this,KDataStream *stream)

{
  float *pfVar1;
  float *pfVar2;
  
  GridData::Encode(&this->super_GridData,stream);
  KDataStream::Write<unsigned_short>(stream,*(unsigned_short *)&(this->super_GridData).field_0xc);
  pfVar1 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar2 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar2 != pfVar1; pfVar2 = pfVar2 + 1) {
    KDataStream::Write<float>(stream,*pfVar2);
  }
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  return;
}

Assistant:

void GridDataType2::Encode( KDataStream & stream ) const
{
    GridData::Encode( stream );

    stream << m_ui16NumValues;

    vector<KFLOAT32>::const_iterator citr = m_vf32Values.begin();
    vector<KFLOAT32>::const_iterator citrEnd = m_vf32Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    stream << m_ui16Padding;
}